

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O3

type jsoncons::
     encode_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *val,
               basic_ostream<char,_std::char_traits<char>_> *os,
               basic_json_encode_options<char> *options,indenting indent)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined7 in_register_00000009;
  value_type *__val;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> encoder;
  allocator<char> local_2d9;
  stream_sink<char> local_2d8;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> local_2a0;
  
  local_2d8.stream_ptr_ = os;
  if ((int)CONCAT71(in_register_00000009,indent) == 0) {
    pcVar2 = (pointer)operator_new(0x4000);
    pcVar1 = pcVar2 + 0x4000;
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar2;
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pcVar1;
    memset(pcVar2,0,0x4000);
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
    local_2d8.begin_buffer_ = pcVar2;
    local_2d8.end_buffer_ = pcVar1;
    local_2d8.p_ = pcVar2;
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    basic_compact_json_encoder
              ((basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                *)&local_2a0,&local_2d8,options,&local_2d9);
    stream_sink<char>::~stream_sink(&local_2d8);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (val,&local_2a0.super_basic_json_visitor<char>);
    basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_compact_json_encoder
              ((basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                *)&local_2a0);
  }
  else {
    pcVar2 = (pointer)operator_new(0x4000);
    pcVar1 = pcVar2 + 0x4000;
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar2;
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pcVar1;
    memset(pcVar2,0,0x4000);
    local_2d8.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
    local_2d8.begin_buffer_ = pcVar2;
    local_2d8.end_buffer_ = pcVar1;
    local_2d8.p_ = pcVar2;
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::basic_json_encoder
              (&local_2a0,&local_2d8,options,&local_2d9);
    stream_sink<char>::~stream_sink(&local_2d8);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (val,&local_2a0.super_basic_json_visitor<char>);
    basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
    ~basic_json_encoder(&local_2a0);
  }
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value>::type
    encode_json(const T& val, std::basic_ostream<CharT>& os, 
        const basic_json_encode_options<CharT>& options = basic_json_encode_options<CharT>(),
        indenting indent = indenting::no_indent)
    {
        if (indent == indenting::no_indent)
        {
            basic_compact_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
        else
        {
            basic_json_encoder<CharT> encoder(os, options);
            val.dump(encoder);
        }
    }